

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlCtxtGetStatus(xmlParserCtxt *ctxt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  if (ctxt == (xmlParserCtxt *)0x0) {
    return 0xb;
  }
  iVar1 = xmlIsCatastrophicError((ctxt->lastError).level,(ctxt->lastError).code);
  if (iVar1 == 0) {
    bVar4 = ctxt->wellFormed == 0;
    uVar2 = bVar4 + 2;
    if (ctxt->nsWellFormed != 0) {
      uVar2 = (uint)bVar4;
    }
    uVar3 = uVar2;
    if ((ctxt->validate != 0) && (uVar3 = uVar2 + 4, ctxt->valid != 0)) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar3 = (uint)(ctxt->validate != 0) * 4 + 0xb;
  }
  return uVar3;
}

Assistant:

int
xmlCtxtGetStatus(xmlParserCtxt *ctxt) {
    int bits = 0;

    if (xmlCtxtIsCatastrophicError(ctxt)) {
        bits |= XML_STATUS_CATASTROPHIC_ERROR |
                XML_STATUS_NOT_WELL_FORMED |
                XML_STATUS_NOT_NS_WELL_FORMED;
        if ((ctxt != NULL) && (ctxt->validate))
            bits |= XML_STATUS_DTD_VALIDATION_FAILED;

        return(bits);
    }

    if (!ctxt->wellFormed)
        bits |= XML_STATUS_NOT_WELL_FORMED;
    if (!ctxt->nsWellFormed)
        bits |= XML_STATUS_NOT_NS_WELL_FORMED;
    if ((ctxt->validate) && (!ctxt->valid))
        bits |= XML_STATUS_DTD_VALIDATION_FAILED;

    return(bits);
}